

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall CDirectiveIncbin::CDirectiveIncbin(CDirectiveIncbin *this,path *fileName)

{
  path *this_00;
  bool bVar1;
  uintmax_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  error_code error;
  string local_38;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveIncbin_001c30a8;
  this_00 = &this->fileName;
  ghc::filesystem::path::path(this_00);
  (this->startExpression).expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->startExpression).expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->startExpression).constExpression = true;
  (this->sizeExpression).expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->sizeExpression).expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sizeExpression).constExpression = true;
  this->size = 0;
  this->start = 0;
  getFullPathName((path *)&local_38,fileName);
  ghc::filesystem::path::operator=(this_00,(path *)&local_38);
  ghc::filesystem::path::~path((path *)&local_38);
  bVar1 = ghc::filesystem::exists(this_00);
  if (!bVar1) {
    ghc::filesystem::path::u8string_abi_cxx11_(&local_38,this_00);
    Logger::printError<std::__cxx11::string>((Logger *)0x2,0x191911,(char *)&local_38,in_RCX);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_),
                      local_38.field_2._M_allocated_capacity + 1);
    }
  }
  local_38._M_dataplus._M_p._0_4_ = 0;
  local_38._M_string_length = std::_V2::system_category();
  uVar2 = ghc::filesystem::file_size(this_00,(error_code *)&local_38);
  this->fileSize = uVar2;
  return;
}

Assistant:

CDirectiveIncbin::CDirectiveIncbin(const fs::path& fileName)
	: size(0), start(0)
{
	this->fileName = getFullPathName(fileName);

	if (!fs::exists(this->fileName))
	{
		Logger::printError(Logger::FatalError, "File %s not found",this->fileName.u8string());
	}

	std::error_code error;
	this->fileSize = static_cast<int64_t>(fs::file_size(this->fileName, error));
}